

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_decoder.h
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerTraversalPredictiveDecoder::Start
          (MeshEdgebreakerTraversalPredictiveDecoder *this,DecoderBuffer *out_buffer)

{
  bool bVar1;
  int32_t num_split_symbols;
  value_type_conflict1 local_20;
  int local_1c;
  
  bVar1 = MeshEdgebreakerTraversalDecoder::Start
                    (&this->super_MeshEdgebreakerTraversalDecoder,out_buffer);
  if (((bVar1) && (bVar1 = DecoderBuffer::Decode<int>(out_buffer,&local_1c), -1 < local_1c && bVar1)
      ) && (local_1c < this->num_vertices_)) {
    local_20 = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->vertex_valences_,(ulong)(uint)this->num_vertices_,&local_20);
    bVar1 = RAnsBitDecoder::StartDecoding(&this->prediction_decoder_,out_buffer);
    return bVar1;
  }
  return false;
}

Assistant:

bool Start(DecoderBuffer *out_buffer) {
    if (!MeshEdgebreakerTraversalDecoder::Start(out_buffer)) {
      return false;
    }
    int32_t num_split_symbols;
    if (!out_buffer->Decode(&num_split_symbols) || num_split_symbols < 0)
      return false;
    if (num_split_symbols >= num_vertices_) {
      return false;
    }
    // Set the valences of all initial vertices to 0.
    vertex_valences_.resize(num_vertices_, 0);
    if (!prediction_decoder_.StartDecoding(out_buffer)) {
      return false;
    }
    return true;
  }